

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.hpp
# Opt level: O0

front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
util::Lexer::
Lex<std::front_insert_iterator<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (Lexer *this,
          front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it)

{
  byte bVar1;
  front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  string local_98;
  front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78 [3];
  string local_60;
  undefined1 local_40 [8];
  string t;
  Lexer *this_local;
  front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_local;
  
  t.field_2._8_8_ = this;
  this_local = (Lexer *)it.container;
  std::__cxx11::string::string((string *)local_40);
  ReadToken_abi_cxx11_(&local_60,this);
  std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  while( true ) {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    local_78[0] = std::
                  front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++((front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&this_local,0);
    this_00 = std::
              front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(local_78);
    std::
    front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(this_00,(value_type *)local_40);
    ReadToken_abi_cxx11_(&local_98,this);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  it_local.container =
       (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this_local;
  std::__cxx11::string::~string((string *)local_40);
  return (front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )it_local.container;
}

Assistant:

IT Lex(IT it)
			{
				std::string t;

				for (t = ReadToken(); !t.empty(); t = ReadToken())
					*it++ = t;

				return it;
			}